

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O2

void __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
::solver_inequalities_101coeff
          (solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  value_bit_array<_1,_1> *this_00;
  unique_ptr<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
  *__num;
  pointer pfVar2;
  bound_factor *pbVar3;
  long lVar4;
  pointer pmVar5;
  int iVar6;
  int index;
  int iVar7;
  int iVar8;
  ulong uVar9;
  pointer pfVar10;
  int iVar11;
  string_view name;
  
  name._M_str = "solver_inequalities_101coeff";
  name._M_len = 0x1c;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  std::make_unique<double[]>((size_t)&this->P);
  this_00 = &this->A;
  bit_array_impl::bit_array_impl(&this_00->super_bit_array_impl,(this->ap).m_rows_values.m_length);
  compute_reduced_costs_vector_size(csts);
  std::
  make_unique<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>
            ((size_t)&this->R);
  __num = &this->b;
  std::
  make_unique<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::bound_factor[]>
            ((size_t)__num);
  std::make_unique<double[]>((size_t)&this->pi);
  this->c = c_;
  this->m = m_;
  this->n = n_;
  pmVar5 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(csts->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar5;
  uVar9 = 0;
  index = 0;
  do {
    if (uVar9 == (lVar4 / 0x28 & 0xffffffffU)) {
      return;
    }
    iVar11 = 0;
    iVar6 = 0;
    pfVar2 = *(pointer *)
              ((long)&pmVar5[uVar9].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    for (pfVar10 = *(pointer *)
                    &pmVar5[uVar9].elements.
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl; pfVar10 != pfVar2; pfVar10 = pfVar10 + 1) {
      if ((pfVar10->factor + 1U & 0xfffffffd) != 0) {
        details::fail_fast("Postcondition","std::abs(cst.factor) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-101.cpp"
                           ,"104");
      }
      if (pfVar10->factor < 1) {
        bit_array_impl::unset(&this_00->super_bit_array_impl,index);
      }
      else {
        bit_array_impl::set(&this_00->super_bit_array_impl,index);
      }
      index = index + 1;
      iVar11 = iVar11 + (uint)(0 < pfVar10->factor);
      iVar6 = iVar6 + (uint)(pfVar10->factor < 1);
    }
    pmVar5 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar8 = pmVar5[uVar9].min;
    pmVar1 = pmVar5 + uVar9;
    if (iVar8 == pmVar5[uVar9].max) {
      pbVar3 = (__num->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor_*,_false>
               ._M_head_impl;
      pbVar3[uVar9].min = iVar8;
      pbVar3[uVar9].max = iVar8;
      pbVar3[uVar9].negative_factor = iVar6;
    }
    else {
      iVar7 = -iVar6;
      if (iVar8 != iVar7 && SBORROW4(iVar8,iVar7) == iVar8 + iVar6 < 0) {
        iVar7 = iVar8;
      }
      pbVar3 = (__num->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor_*,_false>
               ._M_head_impl;
      pbVar3[uVar9].min = iVar7;
      iVar8 = pmVar1->max;
      if (iVar11 <= pmVar1->max) {
        iVar8 = iVar11;
      }
      pbVar3[uVar9].max = iVar8;
      pbVar3[uVar9].negative_factor = iVar6;
      if (iVar8 < iVar7) {
        details::fail_fast("Postcondition","b[i].min <= b[i].max",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-101.cpp"
                           ,"127");
      }
    }
    uVar9 = uVar9 + 1;
    if (iVar6 + iVar11 !=
        (int)((ulong)((long)*(pointer *)
                             ((long)&(pmVar1->elements).
                                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                     ._M_impl + 8) -
                     *(long *)&(pmVar1->elements).
                               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                               ._M_impl) >> 3)) {
      details::fail_fast("Postcondition","upper + lower == length(csts[i].elements)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-101.cpp"
                         ,"128");
    }
  } while( true );
}

Assistant:

solver_inequalities_101coeff(random_engine& rng_,
                                 int m_,
                                 int n_,
                                 const cost_type& c_,
                                 const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(static_cast<int>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);

                if (cst.factor > 0)
                    A.set(id++);
                else
                    A.unset(id++);

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            b[i].negative_factor = lower;

            bx_ensures(b[i].min <= b[i].max);
            bx_ensures(upper + lower == length(csts[i].elements));
        }
    }